

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall aiNode::aiNode(aiNode *this,string *name)

{
  string *name_local;
  aiNode *this_local;
  
  aiString::aiString(&this->mName,name);
  aiMatrix4x4t<float>::aiMatrix4x4t(&this->mTransformation);
  this->mParent = (aiNode *)0x0;
  this->mNumChildren = 0;
  this->mChildren = (aiNode **)0x0;
  this->mNumMeshes = 0;
  this->mMeshes = (uint *)0x0;
  this->mMetaData = (aiMetadata *)0x0;
  return;
}

Assistant:

aiNode::aiNode(const std::string& name)
: mName(name)
, mParent(NULL)
, mNumChildren(0)
, mChildren(NULL)
, mNumMeshes(0)
, mMeshes(NULL)
, mMetaData(NULL) {
    // empty
}